

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::visitProFile(QMakeEvaluator *this,ProFile *pro,EvalFileType type,LoadFlags flags)

{
  long lVar1;
  QMakeGlobals *pQVar2;
  bool bVar3;
  VisitReturn VVar4;
  QMakeBaseEnv **ppQVar5;
  QMakeBaseEnv *pQVar6;
  QMakeEvaluator *pQVar7;
  QArrayDataPointer<ProString> *pQVar8;
  storage_type *psVar9;
  _Base_ptr p_Var10;
  QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
  *pQVar11;
  _Rb_tree_node_base *p_Var12;
  char16_t *pcVar13;
  VisitReturn VVar14;
  ProFile *pPVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QLatin1StringView local_f0;
  QLatin1StringView local_e0;
  QArrayDataPointer<char16_t> local_d0 [2];
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<ProString> local_88;
  QMakeBaseKey local_70;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  VVar14 = ReturnFalse;
  if (pro->m_ok != true) goto LAB_001fbf12;
  if (((uint)flags.super_QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>.
             super_QFlagsStorage<QMakeEvaluator::LoadFlag>.i & 1) == 0) {
    if (this->m_valuemapInited == false) {
      loadDefaults(this);
    }
  }
  else {
    local_70.root.d.d = (pro->m_directoryName).d.d;
    local_70.root.d.ptr = (pro->m_directoryName).d.ptr;
    local_70.root.d.size = (pro->m_directoryName).d.size;
    if (local_70.root.d.d != (Data *)0x0) {
      LOCK();
      ((local_70.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.root.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    prepareProject(this,&local_70.root);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
    bVar3 = pro->m_hostBuild;
    this->m_hostBuild = bVar3;
    pQVar2 = this->m_option;
    QMakeBaseKey::QMakeBaseKey(&local_70,&this->m_buildRoot,&this->m_stashfile,bVar3);
    ppQVar5 = QHash<QMakeBaseKey,_QMakeBaseEnv_*>::operator[](&pQVar2->baseEnvs,&local_70);
    QMakeBaseKey::~QMakeBaseKey(&local_70);
    pQVar6 = *ppQVar5;
    if (pQVar6 == (QMakeBaseEnv *)0x0) {
      pQVar6 = (QMakeBaseEnv *)operator_new(8);
      pQVar6->evaluator = (QMakeEvaluator *)0x0;
      *ppQVar5 = pQVar6;
    }
    pQVar7 = pQVar6->evaluator;
    VVar14 = ReturnFalse;
    if (pQVar7 == (QMakeEvaluator *)0x0) {
      pQVar7 = (QMakeEvaluator *)operator_new(0x2b0);
      QMakeEvaluator(pQVar7,this->m_option,this->m_parser,this->m_vfs,this->m_handler);
      pQVar6->evaluator = pQVar7;
      QString::operator=(&pQVar7->m_superfile,(QString *)&this->m_superfile);
      QString::operator=(&pQVar7->m_conffile,(QString *)&this->m_conffile);
      QString::operator=(&pQVar7->m_cachefile,(QString *)&this->m_cachefile);
      QString::operator=(&pQVar7->m_stashfile,(QString *)&this->m_stashfile);
      QString::operator=(&pQVar7->m_sourceRoot,(QString *)&this->m_sourceRoot);
      QString::operator=(&pQVar7->m_buildRoot,(QString *)&this->m_buildRoot);
      pQVar7->m_hostBuild = this->m_hostBuild;
      bVar3 = loadSpec(pQVar7);
      if (!bVar3) goto LAB_001fbf12;
      pQVar7 = pQVar6->evaluator;
    }
    initFrom(this,pQVar7);
  }
  lVar1 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if (lVar1 == 0) {
    pPVar15 = (ProFile *)0x0;
  }
  else {
    pPVar15 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar1 + -1];
  }
  (**(code **)(*(long *)this->m_handler + 0x10))(this->m_handler,pPVar15,pro,type);
  QList<ProFile_*>::append(&(this->m_profileStack).super_QList<ProFile_*>,pro);
  currentDirectory((QString *)&local_a0,this);
  ProString::ProString((ProString *)&local_70,(QString *)&local_a0);
  ProStringList::ProStringList((ProStringList *)&local_88,(ProString *)&local_70);
  ProKey::ProKey((ProKey *)local_d0,"PWD");
  pQVar8 = (QArrayDataPointer<ProString> *)valuesRef(this,(ProKey *)local_d0);
  QArrayDataPointer<ProString>::operator=(pQVar8,&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_d0);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  VVar14 = ReturnError;
  if (((uint)flags.super_QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>.
             super_QFlagsStorage<QMakeEvaluator::LoadFlag>.i & 1) == 0) {
LAB_001fbc3c:
    if (this->m_debugLevel != 0) {
      local_d0[0].d = (pro->m_fileName).d.d;
      local_d0[0].ptr = (pro->m_fileName).d.ptr;
      local_d0[0].size = (pro->m_fileName).d.size;
      if (local_d0[0].d != (Data *)0x0) {
        LOCK();
        ((local_d0[0].d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_d0[0].d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::toLocal8Bit((QByteArray *)&local_70,(QString *)local_d0);
      pcVar13 = local_70.root.d.ptr;
      if (local_70.root.d.ptr == (char16_t *)0x0) {
        pcVar13 = (char16_t *)&QByteArray::_empty;
      }
      debugMsgInternal(this,1,"visiting file %s",pcVar13);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(local_d0);
    }
    pcVar13 = (pro->m_proitems).d.ptr;
    if (pcVar13 == (char16_t *)0x0) {
      pcVar13 = (char16_t *)&QString::_empty;
    }
    VVar4 = visitProBlock(this,pro,(ushort *)pcVar13);
    if (VVar4 != ReturnError) {
      if (this->m_debugLevel != 0) {
        local_d0[0].d = (pro->m_fileName).d.d;
        local_d0[0].ptr = (pro->m_fileName).d.ptr;
        local_d0[0].size = (pro->m_fileName).d.size;
        if (local_d0[0].d != (Data *)0x0) {
          LOCK();
          ((local_d0[0].d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d0[0].d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        QString::toLocal8Bit((QByteArray *)&local_70,(QString *)local_d0);
        pcVar13 = local_70.root.d.ptr;
        if (local_70.root.d.ptr == (char16_t *)0x0) {
          pcVar13 = (char16_t *)&QByteArray::_empty;
        }
        debugMsgInternal(this,1,"done visiting file %s",pcVar13);
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(local_d0);
      }
      if (((uint)flags.super_QFlagsStorageHelper<QMakeEvaluator::LoadFlag,_4>.
                 super_QFlagsStorage<QMakeEvaluator::LoadFlag>.i & 2) == 0) {
LAB_001fbd51:
        VVar14 = ReturnTrue;
      }
      else {
        pQVar2 = this->m_option;
        psVar9 = (storage_type *)QByteArrayView::lengthHelperCharArray("(command line -after)",0x16)
        ;
        QVar18.m_data = psVar9;
        QVar18.m_size = (qsizetype)&local_70;
        QString::fromLatin1(QVar18);
        evaluateCommand(this,pQVar2->extra_cmds + 2,&local_70.root);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
        applyExtraConfigs(this);
        QLatin1String::QLatin1String(&local_f0,"default_post.prf");
        QString::QString(&local_70.root,local_f0);
        VVar4 = evaluateFeatureFile(this,&local_70.root,false);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
        if (VVar4 != ReturnError) {
          pQVar2 = this->m_option;
          if (pQVar2->extra_cmds[3].d.size != 0) {
            psVar9 = (storage_type *)
                     QByteArrayView::lengthHelperCharArray("(command line -late)",0x15);
            QVar19.m_data = psVar9;
            QVar19.m_size = (qsizetype)&local_70;
            QString::fromLatin1(QVar19);
            evaluateCommand(this,pQVar2->extra_cmds + 3,&local_70.root);
            QArrayDataPointer<char16_t>::~QArrayDataPointer
                      ((QArrayDataPointer<char16_t> *)&local_70);
          }
          VVar4 = evaluateConfigFeatures(this);
          if (VVar4 != ReturnError) goto LAB_001fbd51;
        }
      }
    }
  }
  else {
    setupProject(this);
    pQVar2 = this->m_option;
    if (pQVar2->extra_cmds[0].d.size != 0) {
      psVar9 = (storage_type *)QByteArrayView::lengthHelperCharArray("(command line -early)",0x16);
      QVar16.m_data = psVar9;
      QVar16.m_size = (qsizetype)&local_70;
      QString::fromLatin1(QVar16);
      evaluateCommand(this,pQVar2->extra_cmds,&local_70.root);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
    }
    pQVar11 = (this->m_extraVars).d.d.ptr;
    if (pQVar11 ==
        (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
         *)0x0) {
      p_Var10 = (_Rb_tree_node_base *)0x0;
    }
    else {
      p_Var10 = *(_Base_ptr *)
                 ((long)&(pQVar11->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
    }
    while( true ) {
      p_Var12 = &(pQVar11->m)._M_t._M_impl.super__Rb_tree_header._M_header;
      if (pQVar11 ==
          (QMapData<std::map<ProKey,_ProStringList,_std::less<ProKey>,_std::allocator<std::pair<const_ProKey,_ProStringList>_>_>_>
           *)0x0) {
        p_Var12 = (_Rb_tree_node_base *)0x0;
      }
      if (p_Var10 == p_Var12) break;
      QMap<ProKey,_ProStringList>::insert
                ((QMap<ProKey,_ProStringList> *)
                 ((this->m_valuemapStack).
                  super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  .
                  super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next + 1),(ProKey *)(p_Var10 + 1),
                 (ProStringList *)&p_Var10[2]._M_left);
      p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      pQVar11 = (this->m_extraVars).d.d.ptr;
    }
    applyExtraConfigs(this);
    QLatin1String::QLatin1String(&local_e0,"default_pre.prf");
    QString::QString(&local_70.root,local_e0);
    VVar4 = evaluateFeatureFile(this,&local_70.root,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
    if (VVar4 != ReturnError) {
      pQVar2 = this->m_option;
      if (pQVar2->extra_cmds[1].d.size != 0) {
        psVar9 = (storage_type *)QByteArrayView::lengthHelperCharArray("(command line)",0xf);
        QVar17.m_data = psVar9;
        QVar17.m_size = (qsizetype)&local_70;
        QString::fromLatin1(QVar17);
        evaluateCommand(this,pQVar2->extra_cmds + 1,&local_70.root);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
        applyExtraConfigs(this);
      }
      goto LAB_001fbc3c;
    }
  }
  QList<ProFile_*>::takeLast(&(this->m_profileStack).super_QList<ProFile_*>);
  currentDirectory((QString *)&local_a0,this);
  ProString::ProString((ProString *)&local_70,(QString *)&local_a0);
  ProStringList::ProStringList((ProStringList *)&local_88,(ProString *)&local_70);
  ProKey::ProKey((ProKey *)local_d0,"PWD");
  pQVar8 = (QArrayDataPointer<ProString> *)valuesRef(this,(ProKey *)local_d0);
  QArrayDataPointer<ProString>::operator=(pQVar8,&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(local_d0);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_70);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
  lVar1 = (this->m_profileStack).super_QList<ProFile_*>.d.size;
  if (lVar1 == 0) {
    pPVar15 = (ProFile *)0x0;
  }
  else {
    pPVar15 = (this->m_profileStack).super_QList<ProFile_*>.d.ptr[lVar1 + -1];
  }
  (**(code **)(*(long *)this->m_handler + 0x18))(this->m_handler,pPVar15);
LAB_001fbf12:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return VVar14;
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::visitProFile(
        ProFile *pro, QMakeHandler::EvalFileType type, LoadFlags flags)
{
    if (!m_cumulative && !pro->isOk())
        return ReturnFalse;

    if (flags & LoadPreFiles) {
        if (!prepareProject(pro->directoryName()))
            return ReturnFalse;

        m_hostBuild = pro->isHostBuild();

#ifdef PROEVALUATOR_THREAD_SAFE
        m_option->mutex.lock();
#endif
        QMakeBaseEnv **baseEnvPtr = &m_option->baseEnvs[QMakeBaseKey(m_buildRoot, m_stashfile, m_hostBuild)];
        if (!*baseEnvPtr)
            *baseEnvPtr = new QMakeBaseEnv;
        QMakeBaseEnv *baseEnv = *baseEnvPtr;

#ifdef PROEVALUATOR_THREAD_SAFE
        QMutexLocker locker(&baseEnv->mutex);
        m_option->mutex.unlock();
        if (baseEnv->inProgress) {
            QThreadPool::globalInstance()->releaseThread();
            baseEnv->cond.wait(&baseEnv->mutex);
            QThreadPool::globalInstance()->reserveThread();
            if (!baseEnv->isOk)
                return ReturnFalse;
        } else
#endif
        if (!baseEnv->evaluator) {
#ifdef PROEVALUATOR_THREAD_SAFE
            baseEnv->inProgress = true;
            locker.unlock();
#endif

            QMakeEvaluator *baseEval = new QMakeEvaluator(m_option, m_parser, m_vfs, m_handler);
            baseEnv->evaluator = baseEval;
            baseEval->m_superfile = m_superfile;
            baseEval->m_conffile = m_conffile;
            baseEval->m_cachefile = m_cachefile;
            baseEval->m_stashfile = m_stashfile;
            baseEval->m_sourceRoot = m_sourceRoot;
            baseEval->m_buildRoot = m_buildRoot;
            baseEval->m_hostBuild = m_hostBuild;
            bool ok = baseEval->loadSpec();

#ifdef PROEVALUATOR_THREAD_SAFE
            locker.relock();
            baseEnv->isOk = ok;
            baseEnv->inProgress = false;
            baseEnv->cond.wakeAll();
#endif

            if (!ok)
                return ReturnFalse;
        }
#ifdef PROEVALUATOR_THREAD_SAFE
        else if (!baseEnv->isOk)
            return ReturnFalse;
#endif

        initFrom(baseEnv->evaluator);
    } else {
        if (!m_valuemapInited)
            loadDefaults();
    }

    VisitReturn vr;

    m_handler->aboutToEval(currentProFile(), pro, type);
    m_profileStack.push(pro);
    valuesRef(ProKey("PWD")) = ProStringList(ProString(currentDirectory()));
    if (flags & LoadPreFiles) {
        setupProject();

        if (!m_option->extra_cmds[QMakeEvalEarly].isEmpty())
            evaluateCommand(m_option->extra_cmds[QMakeEvalEarly], fL1S("(command line -early)"));

        for (ProValueMap::ConstIterator it = m_extraVars.constBegin();
             it != m_extraVars.constEnd(); ++it)
            m_valuemapStack.front().insert(it.key(), it.value());

        // In case default_pre needs to make decisions based on the current
        // build pass configuration.
        applyExtraConfigs();

        if ((vr = evaluateFeatureFile(QLatin1String("default_pre.prf"))) == ReturnError)
            goto failed;

        if (!m_option->extra_cmds[QMakeEvalBefore].isEmpty()) {
            evaluateCommand(m_option->extra_cmds[QMakeEvalBefore], fL1S("(command line)"));

            // Again, after user configs, to override them
            applyExtraConfigs();
        }
    }

    debugMsg(1, "visiting file %s", qPrintable(pro->fileName()));
    if ((vr = visitProBlock(pro, pro->tokPtr())) == ReturnError)
        goto failed;
    debugMsg(1, "done visiting file %s", qPrintable(pro->fileName()));

    if (flags & LoadPostFiles) {
        evaluateCommand(m_option->extra_cmds[QMakeEvalAfter], fL1S("(command line -after)"));

        // Again, to ensure the project does not mess with us.
        // Specifically, do not allow a project to override debug/release within a
        // debug_and_release build pass - it's too late for that at this point anyway.
        applyExtraConfigs();

        if ((vr = evaluateFeatureFile(QLatin1String("default_post.prf"))) == ReturnError)
            goto failed;

        if (!m_option->extra_cmds[QMakeEvalLate].isEmpty())
            evaluateCommand(m_option->extra_cmds[QMakeEvalLate], fL1S("(command line -late)"));

        if ((vr = evaluateConfigFeatures()) == ReturnError)
            goto failed;
    }
    vr = ReturnTrue;
  failed:
    m_profileStack.pop();
    valuesRef(ProKey("PWD")) = ProStringList(ProString(currentDirectory()));
    m_handler->doneWithEval(currentProFile());

    return vr;
}